

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::substitute_internal::Arg::Arg(Arg *this,Nullable<const_void_*> value)

{
  Arg *pAVar1;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  Nullable<const_void_*> local_38;
  uintptr_t num;
  char *ptr;
  char *local_20;
  Nullable<const_void_*> local_18;
  Nullable<const_void_*> value_local;
  Arg *this_local;
  
  local_18 = value;
  value_local = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->piece_);
  if (local_18 == (Nullable<const_void_*>)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&ptr,"NULL");
    (this->piece_)._M_len = (size_t)ptr;
    (this->piece_)._M_str = local_20;
  }
  else {
    local_38 = local_18;
    pAVar1 = this + 1;
    do {
      num = (uintptr_t)pAVar1;
      *(char *)(num - 1) = "0123456789abcdef"[(ulong)local_38 & 0xf];
      local_38 = (Nullable<const_void_*>)((ulong)local_38 >> 4);
      pAVar1 = (Arg *)(num - 1);
    } while (local_38 != (Nullable<const_void_*>)0x0);
    *(undefined1 *)(num - 2) = 0x78;
    __str = (char *)(num - 3);
    *(undefined1 *)(num - 3) = 0x30;
    num = (uintptr_t)__str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,__str,(long)this + (0x30 - (long)__str));
    (this->piece_)._M_len = local_48._M_len;
    (this->piece_)._M_str = local_48._M_str;
  }
  return;
}

Assistant:

Arg::Arg(absl::Nullable<const void*> value) {
  static_assert(sizeof(scratch_) >= sizeof(value) * 2 + 2,
                "fix sizeof(scratch_)");
  if (value == nullptr) {
    piece_ = "NULL";
  } else {
    char* ptr = scratch_ + sizeof(scratch_);
    uintptr_t num = reinterpret_cast<uintptr_t>(value);
    do {
      *--ptr = absl::numbers_internal::kHexChar[num & 0xf];
      num >>= 4;
    } while (num != 0);
    *--ptr = 'x';
    *--ptr = '0';
    piece_ = absl::string_view(
        ptr, static_cast<size_t>(scratch_ + sizeof(scratch_) - ptr));
  }
}